

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O0

int MuxImageParse(WebPChunk *chunk,int copy_data,WebPMuxImage *wpi)

{
  long lVar1;
  ulong uVar2;
  WebPMuxError WVar3;
  WebPChunkId WVar4;
  int iVar5;
  size_t data_size;
  size_t sVar6;
  uint8_t *data;
  long in_RDX;
  long in_RDI;
  WebPData temp;
  size_t hdr_size;
  WebPChunk **unknown_chunk_list;
  size_t subchunk_size;
  WebPChunk subchunk;
  uint8_t *last;
  size_t size;
  uint8_t *bytes;
  uint32_t in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  WebPChunk *pWVar7;
  WebPChunk *chunk_00;
  undefined8 uVar8;
  WebPMuxImage *wpi_00;
  uint32_t in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  WebPChunk *local_28;
  
  lVar1 = *(long *)(in_RDI + 8);
  uVar2 = *(ulong *)(in_RDI + 0x10);
  if (lVar1 == 0) {
    pWVar7 = (WebPChunk *)0x0;
  }
  else {
    pWVar7 = (WebPChunk *)(lVar1 + uVar2);
  }
  data_size = in_RDX + 0x18;
  chunk_00 = pWVar7;
  ChunkInit((WebPChunk *)0x109f3f);
  wpi_00 = (WebPMuxImage *)0x10;
  uVar8 = 0;
  if (0xf < uVar2) {
    ChunkAssignData(chunk_00,(WebPData *)
                             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                    in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    ChunkSetHead(chunk_00,(WebPChunk **)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    *(undefined4 *)(in_RDX + 0x2c) = 1;
    sVar6 = ChunkDiskSize((WebPChunk *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                         );
    data = (uint8_t *)(sVar6 - 8);
    for (local_28 = (WebPChunk *)(data + lVar1); local_28 != pWVar7;
        local_28 = (WebPChunk *)(data + (long)local_28)) {
      ChunkInit((WebPChunk *)0x109ff1);
      WVar3 = ChunkVerifyAndAssign
                        ((WebPChunk *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         data,data_size,(size_t)wpi_00,(int)((ulong)uVar8 >> 0x20));
      if (WVar3 != WEBP_MUX_OK) goto LAB_0010a151;
      WVar4 = ChunkGetIdFromTag(in_stack_ffffffffffffffa8);
      if (WVar4 == WEBP_CHUNK_ALPHA) {
        if ((*(long *)(in_RDX + 8) != 0) ||
           (WVar3 = ChunkSetHead(chunk_00,(WebPChunk **)CONCAT44(5,in_stack_ffffffffffffff70)),
           WVar3 != WEBP_MUX_OK)) goto LAB_0010a151;
        *(undefined4 *)(in_RDX + 0x2c) = 1;
      }
      else if (WVar4 == WEBP_CHUNK_IMAGE) {
        if (((*(long *)(in_RDX + 0x10) != 0) ||
            (WVar3 = ChunkSetHead(chunk_00,(WebPChunk **)CONCAT44(6,in_stack_ffffffffffffff70)),
            WVar3 != WEBP_MUX_OK)) || (iVar5 = MuxImageFinalize(wpi_00), iVar5 == 0))
        goto LAB_0010a151;
        *(undefined4 *)(in_RDX + 0x2c) = 0;
      }
      else if (((WVar4 != WEBP_CHUNK_UNKNOWN) || (*(int *)(in_RDX + 0x2c) != 0)) ||
              (WVar3 = ChunkAppend((WebPChunk *)CONCAT44(9,in_stack_ffffffffffffff70),
                                   (WebPChunk ***)
                                   CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)),
              WVar3 != WEBP_MUX_OK)) goto LAB_0010a151;
      data = (uint8_t *)ChunkDiskSize((WebPChunk *)CONCAT44(WVar4,in_stack_ffffffffffffff70));
    }
    if (*(int *)(in_RDX + 0x2c) == 0) {
      return 1;
    }
  }
LAB_0010a151:
  ChunkRelease((WebPChunk *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  return 0;
}

Assistant:

static int MuxImageParse(const WebPChunk* const chunk, int copy_data,
                         WebPMuxImage* const wpi) {
  const uint8_t* bytes = chunk->data_.bytes;
  size_t size = chunk->data_.size;
  const uint8_t* const last = (bytes == NULL) ? NULL : bytes + size;
  WebPChunk subchunk;
  size_t subchunk_size;
  WebPChunk** unknown_chunk_list = &wpi->unknown_;
  ChunkInit(&subchunk);

  assert(chunk->tag_ == kChunks[IDX_ANMF].tag);
  assert(!wpi->is_partial_);

  // ANMF.
  {
    const size_t hdr_size = ANMF_CHUNK_SIZE;
    const WebPData temp = { bytes, hdr_size };
    // Each of ANMF chunk contain a header at the beginning. So, its size should
    // be at least 'hdr_size'.
    if (size < hdr_size) goto Fail;
    ChunkAssignData(&subchunk, &temp, copy_data, chunk->tag_);
  }
  ChunkSetHead(&subchunk, &wpi->header_);
  wpi->is_partial_ = 1;  // Waiting for ALPH and/or VP8/VP8L chunks.

  // Rest of the chunks.
  subchunk_size = ChunkDiskSize(&subchunk) - CHUNK_HEADER_SIZE;
  bytes += subchunk_size;
  size -= subchunk_size;

  while (bytes != last) {
    ChunkInit(&subchunk);
    if (ChunkVerifyAndAssign(&subchunk, bytes, size, size,
                             copy_data) != WEBP_MUX_OK) {
      goto Fail;
    }
    switch (ChunkGetIdFromTag(subchunk.tag_)) {
      case WEBP_CHUNK_ALPHA:
        if (wpi->alpha_ != NULL) goto Fail;  // Consecutive ALPH chunks.
        if (ChunkSetHead(&subchunk, &wpi->alpha_) != WEBP_MUX_OK) goto Fail;
        wpi->is_partial_ = 1;  // Waiting for a VP8 chunk.
        break;
      case WEBP_CHUNK_IMAGE:
        if (wpi->img_ != NULL) goto Fail;  // Only 1 image chunk allowed.
        if (ChunkSetHead(&subchunk, &wpi->img_) != WEBP_MUX_OK) goto Fail;
        if (!MuxImageFinalize(wpi)) goto Fail;
        wpi->is_partial_ = 0;  // wpi is completely filled.
        break;
      case WEBP_CHUNK_UNKNOWN:
        if (wpi->is_partial_) {
          goto Fail;  // Encountered an unknown chunk
                      // before some image chunks.
        }
        if (ChunkAppend(&subchunk, &unknown_chunk_list) != WEBP_MUX_OK) {
          goto Fail;
        }
        break;
      default:
        goto Fail;
    }
    subchunk_size = ChunkDiskSize(&subchunk);
    bytes += subchunk_size;
    size -= subchunk_size;
  }
  if (wpi->is_partial_) goto Fail;
  return 1;

 Fail:
  ChunkRelease(&subchunk);
  return 0;
}